

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseSeqId(State *state)

{
  bool bVar1;
  char *pcVar2;
  char *local_30;
  char *p;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    for (local_30 = RemainingInput(guard.state_);
        (*local_30 != '\0' &&
        ((bVar1 = IsDigit(*local_30), bVar1 || (('@' < *local_30 && (*local_30 < '['))))));
        local_30 = local_30 + 1) {
    }
    pcVar2 = RemainingInput(guard.state_);
    if (local_30 == pcVar2) {
      state_local._7_1_ = false;
    }
    else {
      pcVar2 = RemainingInput(guard.state_);
      ((guard.state_)->parse_state).mangled_idx =
           ((guard.state_)->parse_state).mangled_idx + ((int)local_30 - (int)pcVar2);
      anon_unknown_3::UpdateHighWaterMark(guard.state_);
      state_local._7_1_ = true;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseSeqId(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  const char *p = RemainingInput(state);
  for (; *p != '\0'; ++p) {
    if (!IsDigit(*p) && !(*p >= 'A' && *p <= 'Z')) {
      break;
    }
  }
  if (p != RemainingInput(state)) {  // Conversion succeeded.
    state->parse_state.mangled_idx += p - RemainingInput(state);
    UpdateHighWaterMark(state);
    return true;
  }
  return false;
}